

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_SolvesWithNewBounds_Test::
~TwoDimensionalQpTest_SolvesWithNewBounds_Test(TwoDimensionalQpTest_SolvesWithNewBounds_Test *this)

{
  TwoDimensionalQpTest::~TwoDimensionalQpTest(&this->super_TwoDimensionalQpTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, SolvesWithNewBounds) {
  // Fixes x to 2.0.
  VectorXd bound_vector(1);
  bound_vector << 2.0;
  ASSERT_TRUE(solver_.SetBounds(bound_vector, bound_vector).ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);
  EXPECT_NEAR(solver_.objective_value(), 4.0 - 0.5 + 0.5 * 0.5, 2 * kTolerance);
  ExpectElementsAre(solver_.primal_solution(), {2.0, -0.5}, kTolerance);
}